

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::LSTMParams::MergePartialFromCodedStream
          (LSTMParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  float *pfVar5;
  bool bVar6;
  uint uVar7;
  uint32 uVar8;
  undefined8 in_RAX;
  unsigned_long uVar9;
  char cVar10;
  ulong uVar11;
  float fVar12;
  pair<unsigned_long,_bool> pVar13;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
LAB_00136921:
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_00136b7c;
        uVar11 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_00136b7c:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar8 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) != 0) {
      uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar11;
      if (uVar7 == 0x3c) {
        if (cVar10 == -0x1b) {
          pfVar5 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar5 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)((long)&uStack_28 + 4));
            if (!bVar6) {
              return false;
            }
            fVar12 = uStack_28._4_4_;
          }
          else {
            fVar12 = *pfVar5;
            input->buffer_ = (uint8 *)(pfVar5 + 1);
          }
          this->cellclipthreshold_ = fVar12;
          goto LAB_00136921;
        }
      }
      else if (uVar7 == 0x14) {
        if (cVar10 == -0x60) {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar9 = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->hasbiasvectors_ = uVar9 != 0;
          goto LAB_00136921;
        }
      }
      else if (uVar7 == 0x1e) {
        if (cVar10 == -0x10) {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar9 = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->forgetbias_ = uVar9 != 0;
          goto LAB_00136921;
        }
      }
      else if (uVar7 == 0x28) {
        if (cVar10 == '@') {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar9 = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->haspeepholevectors_ = uVar9 != 0;
          goto LAB_00136921;
        }
      }
      else if (uVar7 == 0x32) {
        if (cVar10 == -0x70) {
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) &&
             (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
            uVar9 = pVar13.first;
            if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              return false;
            }
          }
          this->coupledinputandforgetgate_ = uVar9 != 0;
          goto LAB_00136921;
        }
      }
      else if ((uVar7 == 10) && (cVar10 == 'P')) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar9 = (unsigned_long)(char)*puVar4, -1 < (long)uVar9)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar9 = pVar13.first;
          if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->sequenceoutput_ = uVar9 != 0;
        goto LAB_00136921;
      }
    }
    if (uVar8 == 0) {
      return true;
    }
    if ((uVar8 & 7) == 4) {
      return true;
    }
    bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool LSTMParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LSTMParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // bool sequenceOutput = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &sequenceoutput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBiasVectors = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(160u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbiasvectors_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool forgetBias = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(240u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &forgetbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasPeepholeVectors = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(320u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &haspeepholevectors_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool coupledInputAndForgetGate = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(400u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &coupledinputandforgetgate_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float cellClipThreshold = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(485u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &cellclipthreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LSTMParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LSTMParams)
  return false;
#undef DO_
}